

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lut.c
# Opt level: O1

_Bool chck_hash_table_str_set(chck_hash_table *table,char *str,size_t len,void *data)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  _Bool _Var6;
  uint32_t uVar7;
  int iVar8;
  size_t __size;
  uint8_t *__s;
  ulong uVar9;
  header *h;
  chck_hash_table *table_00;
  chck_hash_table *l;
  
  if ((table == (chck_hash_table *)0x0) || (str == (char *)0x0)) {
    __assert_fail("table && str",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/lut/lut.c",
                  0x188,
                  "_Bool chck_hash_table_str_set(struct chck_hash_table *, const char *, size_t, const void *)"
                 );
  }
  uVar7 = (*(table->lut).hashstr)(str,len);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (table->lut).count;
  uVar9 = SUB168(ZEXT416(uVar7) % auVar3,0);
  do {
    l = table;
    uVar1 = (l->meta).count;
    if (uVar1 <= uVar9) {
      __assert_fail("lut && index < lut->count",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/lut/lut.c"
                    ,0x1f,"void *lut_get_index(struct chck_lut *, uint32_t)");
    }
    if ((l->meta).table == (uint8_t *)0x0) {
      uVar2 = (l->meta).member;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar1;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar2;
      __size = SUB168(auVar4 * auVar5,0);
      if (__size == 0 || SUB168(auVar4 * auVar5,8) != 0) {
        __s = (uint8_t *)0x0;
      }
      else {
        __s = (uint8_t *)malloc(__size);
      }
      (l->meta).table = __s;
      if (__s != (uint8_t *)0x0) {
        memset(__s,(l->meta).set,uVar2 * uVar1);
        goto LAB_00101b6f;
      }
      h = (header *)0x0;
    }
    else {
LAB_00101b6f:
      h = (header *)((l->meta).table + (l->meta).member * uVar9);
    }
    table_00 = l;
    if (h == (header *)0x0) {
LAB_00101bb6:
      h = (header *)0x0;
LAB_00101bb8:
      _Var6 = hash_table_set(table_00,l,h,SUB164(ZEXT416(uVar7) % auVar3,0),str,0xffffffff,data);
      return _Var6;
    }
    if ((h->placed != true) ||
       ((h->str_key != (char *)0x0 && (iVar8 = strcmp(h->str_key,str), iVar8 == 0))))
    goto LAB_00101bb8;
    table_00 = (chck_hash_table *)0x0;
    table = l->next;
    if (l->next == (chck_hash_table *)0x0) goto LAB_00101bb6;
  } while( true );
}

Assistant:

bool
chck_hash_table_str_set(struct chck_hash_table *table, const char *str, size_t len, const void *data)
{
   assert(table && str);
   return hash_table_set_str(table, table->lut.hashstr(str, len) % table->lut.count, str, data);
}